

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v5::internal::fp::normalize<1>(fp *this)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = this->f;
  if ((uVar2 & 0x20000000000000) == 0) {
    lVar1 = 0x3f;
    if ((uVar2 & 0x1fffffffffffff) != 0) {
      for (; (uVar2 & 0x1fffffffffffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = uVar2 << (~(byte)lVar1 + 0x36 & 0x3f);
    this->f = uVar2;
    this->e = (this->e - ((uint)lVar1 ^ 0x3f)) + 10;
  }
  this->f = uVar2 << 10;
  this->e = this->e + -10;
  return;
}

Assistant:

void normalize() {
    // Handle subnormals.
    auto shifted_implicit_bit = implicit_bit << SHIFT;
    while ((f & shifted_implicit_bit) == 0) {
      f <<= 1;
      --e;
    }
    // Subtract 1 to account for hidden bit.
    auto offset = significand_size - double_significand_size - SHIFT - 1;
    f <<= offset;
    e -= offset;
  }